

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

bool __thiscall ui::Renderable::hovers(Renderable *this,Point p)

{
  Point PVar1;
  Point PVar2;
  undefined1 auVar3 [16];
  undefined4 in_ECX;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (this->_hoverable != false) {
    PVar1 = (this->super_Area)._origin;
    PVar2 = (this->super_Area)._padding;
    fVar8 = PVar2.x;
    fVar6 = (p.x - PVar1.x) - fVar8;
    fVar9 = PVar2.y;
    fVar7 = (p.y - PVar1.y) - fVar9;
    if (this->_root != this) {
      PVar1 = (this->_root->super_Area)._origin;
      fVar6 = fVar6 - PVar1.x;
      fVar7 = fVar7 - PVar1.y;
    }
    if (((0.0 <= fVar6) && (0.0 <= fVar7)) &&
       (PVar1 = (this->super_Area)._dimension, iVar4 = -(uint)(fVar6 <= PVar1.x - fVar8),
       iVar5 = -(uint)(fVar7 <= PVar1.y - fVar9), auVar3._4_4_ = iVar4, auVar3._0_4_ = iVar4,
       auVar3._8_4_ = iVar5, auVar3._12_4_ = iVar5, iVar4 = movmskpd(in_ECX,auVar3), iVar4 == 3)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool hovers(Point p) {
            if(_hoverable == false) return false;
            Point t = p - origin() - padding();
            if(_root != this) t -= _root->origin();
            if(t >= Point {0, 0} && t <= dimension() - padding()) {
                return true;
            }
            return false;
        }